

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestTestHelpers.hpp
# Opt level: O2

bool testAccEval<float,GridMethodFast>
               (vector<double,_std::allocator<double>_> *x,
               vector<double,_std::allocator<double>_> *y,int numx,double tolerance,
               TasmanianSparseGrid *grid,string *message)

{
  vector<float,_std::allocator<float>_> *pvVar1;
  long lVar2;
  pointer x_00;
  float *y_00;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  vector<float,_std::allocator<float>_> test_y;
  vector<float,_std::allocator<float>_> temp_x;
  allocator_type local_c9;
  double local_c8;
  uint local_bc;
  _Vector_base<float,_std::allocator<float>_> local_b8;
  double local_a0;
  string *local_98;
  vector<double,_std::allocator<double>_> *local_90;
  _Vector_base<float,_std::allocator<float>_> local_88;
  string local_68;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (float *)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (*(long *)(grid + 8) == 0) {
    lVar2 = 0;
  }
  else {
    lVar2 = (long)*(int *)(*(long *)(grid + 8) + 0x10);
  }
  local_c8 = (double)(long)numx;
  local_a0 = tolerance;
  local_98 = message;
  local_90 = y;
  pvVar1 = getVector(x,(vector<float,_std::allocator<float>_> *)&local_88,lVar2 * (long)local_c8);
  if (*(long *)(grid + 8) == 0) {
    lVar2 = 0;
  }
  else {
    lVar2 = (long)*(int *)(*(long *)(grid + 8) + 0x14);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_48,lVar2 * (long)local_c8,&local_c9);
  local_bc = numx;
  std::vector<float,_std::allocator<float>_>::_M_move_assign
            ((vector<float,_std::allocator<float>_> *)&local_b8,&local_48);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  lVar2 = *(long *)(grid + 8);
  uVar4 = 0;
  if (lVar2 == 0) {
    lVar3 = 0;
    lVar2 = 0;
  }
  else {
    lVar3 = (long)*(int *)(lVar2 + 0x10);
    lVar2 = (long)*(int *)(lVar2 + 0x14);
  }
  x_00 = (pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
         ._M_start;
  y_00 = local_b8._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)local_bc) {
    uVar4 = (ulong)local_bc;
  }
  while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
    TasGrid::TasmanianSparseGrid::evaluateFast<float>(grid,x_00,y_00);
    x_00 = x_00 + lVar3;
    y_00 = y_00 + lVar2;
  }
  if (*(long *)(grid + 8) == 0) {
    lVar2 = 0;
  }
  else {
    lVar2 = (long)*(int *)(*(long *)(grid + 8) + 0x14);
  }
  local_c8 = err1<std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>>
                       (lVar2 * (long)local_c8,(vector<float,_std::allocator<float>_> *)&local_b8,
                        local_90);
  std::__cxx11::string::string((string *)&local_68,(string *)local_98);
  bVar5 = testPass(local_c8,local_a0,&local_68,grid);
  std::__cxx11::string::~string((string *)&local_68);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_88);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_b8);
  return bVar5;
}

Assistant:

bool testAccEval(std::vector<double> const &x, std::vector<double> const &y, int numx, double tolerance, TasmanianSparseGrid &grid, std::string message){
    std::vector<T> test_y, temp_x;
    std::vector<T> const &test_x = getVector(x, temp_x, Utils::size_mult(grid.getNumDimensions(), numx));

    if (std::is_same<EvalMethod, GridMethodBatch>::value){
        grid.evaluateBatch(test_x, test_y);
    }else if (std::is_same<EvalMethod, GridMethodFast>::value){
        test_y = std::vector<T>(Utils::size_mult(numx, grid.getNumOutputs()));
        Utils::Wrapper2D<T const> wx(grid.getNumDimensions(), test_x.data());
        Utils::Wrapper2D<T> wy(grid.getNumOutputs(), test_y.data());
        for(int i=0; i<numx; i++)
            grid.evaluateFast(wx.getStrip(i), wy.getStrip(i));
    }
    return testPass(err1(Utils::size_mult(numx, grid.getNumOutputs()), test_y, y), tolerance, message, grid);
}